

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextOptimizationOverrideInfo.cpp
# Opt level: O3

void __thiscall
Js::ScriptContextOptimizationOverrideInfo::Insert
          (ScriptContextOptimizationOverrideInfo *this,ScriptContextOptimizationOverrideInfo *info)

{
  ScriptContextOptimizationOverrideInfo *pSVar1;
  code *pcVar2;
  INT_PTR IVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  IVar3 = this->intArraySetElementFastPathVtable;
  info->arraySetElementFastPathVtable = this->arraySetElementFastPathVtable;
  info->intArraySetElementFastPathVtable = IVar3;
  info->floatArraySetElementFastPathVtable = this->floatArraySetElementFastPathVtable;
  info->sideEffects = this->sideEffects;
  if (this->crossSiteRoot != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextOptimizationOverrideInfo.cpp"
                                ,0x91,"(this == this->crossSiteRoot)","this == this->crossSiteRoot")
    ;
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  info->crossSiteRoot = this;
  info->crossSiteNext = this;
  pSVar1 = this->crossSitePrev;
  info->crossSitePrev = pSVar1;
  pSVar1->crossSiteNext = info;
  this->crossSitePrev = info;
  return;
}

Assistant:

void
ScriptContextOptimizationOverrideInfo::Insert(ScriptContextOptimizationOverrideInfo * info)
{
    // Copy the information
    this->CopyTo(info);

    // Insert
    // Only insert at the root
    Assert(this == this->crossSiteRoot);
    info->crossSiteRoot = this;
    info->crossSiteNext = this;
    info->crossSitePrev = this->crossSitePrev;
    this->crossSitePrev->crossSiteNext = info;
    this->crossSitePrev = info;
}